

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextEngineTests.cpp
# Opt level: O3

void __thiscall
agge::tests::TextEngineTests::GarbageFontIsReusedForTheSameRequest(TextEngineTests *this)

{
  path_point *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pgVar2;
  real_t rVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  unsigned_long *puVar7;
  FailedAssertion *pFVar8;
  font_accessor *this_00;
  long lVar9;
  char_to_index indices [1];
  glyph g;
  fonts_loader loader;
  logging_text_engine e;
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> fonts [2];
  undefined1 local_428 [48];
  undefined1 local_3f8 [24];
  font_descriptor local_3e0;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [40];
  char_to_index local_380;
  undefined1 local_378 [16];
  __buckets_ptr pp_Stack_368;
  iterator local_360;
  __node_base _Stack_358;
  undefined1 local_350 [8];
  undefined1 local_348 [8];
  vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  local_340;
  _Alloc_hider local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  size_t local_300;
  unsigned_long *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0 [6];
  vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
  local_2c0 [24];
  element_type *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  undefined1 local_298 [80];
  real_t local_248;
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  local_240 [48];
  pointer local_210 [3];
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> local_1e8;
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> local_110;
  
  local_380 = (char_to_index)0x61;
  local_378._0_8_ = 0x4014cccccccccccd;
  local_378._8_8_ = (__node_base_ptr)0x0;
  pp_Stack_368 = (__buckets_ptr)0x0;
  local_360._M_current = (path_point *)0x0;
  _Stack_358._M_nxt = (_Hash_node_base *)0x0;
  lVar9 = 0;
  do {
    __args = (path_point *)((long)&c_outline_1 + lVar9);
    if (local_360._M_current == (path_point *)_Stack_358._M_nxt) {
      std::vector<agge::glyph::path_point,std::allocator<agge::glyph::path_point>>::
      _M_realloc_insert<agge::glyph::path_point_const&>
                ((vector<agge::glyph::path_point,std::allocator<agge::glyph::path_point>> *)
                 &pp_Stack_368,local_360,__args);
    }
    else {
      (local_360._M_current)->y = *(real_t *)((long)&DAT_001a1ae8 + lVar9);
      rVar3 = __args->x;
      (local_360._M_current)->command = __args->command;
      (local_360._M_current)->x = rVar3;
      local_360._M_current = local_360._M_current + 1;
    }
    lVar9 = lVar9 + 0xc;
  } while (lVar9 != 0x24);
  local_428._0_8_ = local_428 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Arial","");
  font_descriptor::create
            ((font_descriptor *)(local_428 + 0x20),(string *)local_428,10,regular,false,hint_strong)
  ;
  local_298._0_8_ = &PTR_get_descriptor_001bb5d0;
  local_298._8_4_ = 0;
  local_298._16_8_ = operator_new(8);
  *(unsigned_long *)local_298._16_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_long*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298 + 0x18),
             (unsigned_long *)local_298._16_8_);
  local_298._32_8_ = local_298 + 0x30;
  local_298._40_8_ = (_Hash_node_base *)0x0;
  local_298[0x30] = '\0';
  local_298._72_8_ = (__node_base_ptr)0x40b33333408ccccd;
  local_248 = 7.1;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<agge::tests::mocks::font_accessor::char_to_index_const*>
            (local_240,(char_to_index *)(local_3a8 + 0x28),(char_to_index *)(local_3a8 + 0x30));
  std::
  vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
  ::vector<agge::tests::mocks::font_accessor::glyph*,void>
            ((vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
              *)local_210,(glyph *)(local_3a8 + 0x30),(glyph *)local_350,(allocator_type *)local_348
            );
  local_1f8 = (element_type *)0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<agge::font_descriptor,_agge::tests::mocks::font_accessor>::
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor,_true>
            (&local_1e8,(font_descriptor *)(local_428 + 0x20),(font_accessor *)local_298);
  local_3a8._0_8_ = local_3a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Tahoma","");
  font_descriptor::create(&local_3e0,(string *)local_3a8,10,bold,false,hint_strong);
  local_348 = (undefined1  [8])&PTR_get_descriptor_001bb5d0;
  local_340.
  super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_340.
                        super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_340.
  super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(8);
  ((local_340.
    super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish)->first).family._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_long*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_340.
              super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (unsigned_long *)
             local_340.
             super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_328._M_p = (pointer)&local_318;
  local_320 = 0;
  local_318._M_local_buf[0] = '\0';
  local_300 = 0x40b33333408ccccd;
  local_2f8 = (unsigned_long *)CONCAT44(local_2f8._4_4_,7.1);
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<agge::tests::mocks::font_accessor::char_to_index_const*>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)local_2f0,(char_to_index *)(local_3a8 + 0x28),(char_to_index *)(local_3a8 + 0x30));
  std::
  vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
  ::vector<agge::tests::mocks::font_accessor::glyph*,void>
            (local_2c0,(glyph *)(local_3a8 + 0x30),(glyph *)local_350,(allocator_type *)local_3b8);
  local_2a8 = (element_type *)0x0;
  _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<agge::font_descriptor,_agge::tests::mocks::font_accessor>::
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor,_true>
            (&local_110,&local_3e0,(font_accessor *)local_348);
  mocks::font_accessor::~font_accessor((font_accessor *)local_348);
  paVar1 = &local_3e0.family.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.family._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e0.family._M_dataplus._M_p);
  }
  if ((__node_base_ptr)local_3a8._0_8_ != (__node_base_ptr)(local_3a8 + 0x10)) {
    operator_delete((void *)local_3a8._0_8_);
  }
  mocks::font_accessor::~font_accessor((font_accessor *)local_298);
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_);
  }
  local_348 = (undefined1  [8])&PTR_load_001bb600;
  local_340.
  super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_340.
  super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_340.
  super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  map<agge::font_descriptor,agge::tests::mocks::font_accessor,std::less<agge::font_descriptor>,std::allocator<std::pair<agge::font_descriptor_const,agge::tests::mocks::font_accessor>>>
  ::map<std::pair<agge::font_descriptor,agge::tests::mocks::font_accessor>*>
            ((map<agge::font_descriptor,agge::tests::mocks::font_accessor,std::less<agge::font_descriptor>,std::allocator<std::pair<agge::font_descriptor_const,agge::tests::mocks::font_accessor>>>
              *)&local_328,&local_1e8,
             (pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *)
             &stack0xffffffffffffffc8);
  local_2f8 = (unsigned_long *)operator_new(8);
  *local_2f8 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_long*>
            (local_2f0,local_2f8);
  mocks::logging_text_engine::logging_text_engine
            ((logging_text_engine *)local_298,(loader *)local_348,1);
  local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Arial","");
  font_descriptor::create
            ((font_descriptor *)(local_428 + 0x20),&local_3e0.family,10,regular,false,hint_strong);
  text_engine_base::create_font((text_engine_base *)local_3a8,(font_descriptor *)local_298);
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.family._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e0.family._M_dataplus._M_p);
  }
  local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Tahoma","");
  font_descriptor::create
            ((font_descriptor *)(local_428 + 0x20),&local_3e0.family,10,bold,false,hint_strong);
  text_engine_base::create_font((text_engine_base *)local_3b8,(font_descriptor *)local_298);
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.family._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e0.family._M_dataplus._M_p);
  }
  uVar6 = local_3a8._0_8_;
  uVar4 = local_3b8._0_8_;
  std::
  vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ::_M_erase_at_end(&local_340,
                    local_340.
                    super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  uVar5 = local_3a8._8_8_;
  local_3a8._0_8_ = (__node_base_ptr)0x0;
  local_3a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
  }
  uVar5 = local_3b8._8_8_;
  local_3b8._0_8_ = (_func_int **)0x0;
  local_3b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
  }
  local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Tahoma","");
  font_descriptor::create
            ((font_descriptor *)(local_428 + 0x20),&local_3e0.family,10,bold,false,hint_strong);
  text_engine_base::create_font((text_engine_base *)local_428,(font_descriptor *)local_298);
  uVar5 = local_3b8._8_8_;
  local_3b8._8_8_ = local_428._8_8_;
  local_3b8._0_8_ = local_428._0_8_;
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
  }
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.family._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e0.family._M_dataplus._M_p);
  }
  uVar5 = local_3b8._0_8_;
  local_428._0_8_ = local_428 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)(local_428 + 0x20),(string *)local_428,0x3a5);
  if (uVar4 != uVar5) {
    pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion
              (pFVar8,&local_3e0.family,(LocationInfo *)(local_428 + 0x20));
    __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_);
  }
  local_428._0_8_ = local_428 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)(local_428 + 0x20),(string *)local_428,0x3a6);
  if (local_340.
      super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_340.
      super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e0,"The container is not empty!","");
    ut::FailedAssertion::FailedAssertion
              (pFVar8,&local_3e0.family,(LocationInfo *)(local_428 + 0x20));
    __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_);
  }
  local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Arial","");
  font_descriptor::create
            ((font_descriptor *)(local_428 + 0x20),&local_3e0.family,10,regular,false,hint_strong);
  text_engine_base::create_font((text_engine_base *)local_428,(font_descriptor *)local_298);
  uVar4 = local_3a8._8_8_;
  local_3a8._8_8_ = local_428._8_8_;
  local_3a8._0_8_ = local_428._0_8_;
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
  }
  if ((undefined1 *)local_428._32_8_ != local_3f8) {
    operator_delete((void *)local_428._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.family._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e0.family._M_dataplus._M_p);
  }
  uVar4 = local_3a8._0_8_;
  local_428._0_8_ = local_428 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)(local_428 + 0x20),(string *)local_428,0x3ac);
  if (uVar6 == uVar4) {
    if ((undefined1 *)local_428._32_8_ != local_3f8) {
      operator_delete((void *)local_428._32_8_);
    }
    if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
      operator_delete((void *)local_428._0_8_);
    }
    local_428._0_8_ = local_428 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo((LocationInfo *)(local_428 + 0x20),(string *)local_428,0x3ad);
    if (local_340.
        super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_340.
        super__Vector_base<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e0,"The container is not empty!","");
      ut::FailedAssertion::FailedAssertion
                (pFVar8,&local_3e0.family,(LocationInfo *)(local_428 + 0x20));
      __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    if ((undefined1 *)local_428._32_8_ != local_3f8) {
      operator_delete((void *)local_428._32_8_);
    }
    if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
      operator_delete((void *)local_428._0_8_);
    }
    text_engine_base::collect((text_engine_base *)local_298);
    puVar7 = local_2f8;
    local_428._0_8_ = local_428 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo((LocationInfo *)(local_428 + 0x20),(string *)local_428,0x3b3);
    if (*puVar7 == 2) {
      if ((undefined1 *)local_428._32_8_ != local_3f8) {
        operator_delete((void *)local_428._32_8_);
      }
      if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
        operator_delete((void *)local_428._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
      }
      local_298._0_8_ = &PTR_create_font_001bb5a0;
      if (local_210[0] != (pointer)0x0) {
        operator_delete(local_210[0]);
      }
      text_engine_base::~text_engine_base((text_engine_base *)local_298);
      local_348 = (undefined1  [8])&PTR_load_001bb600;
      if (local_2f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0[0]._M_pi);
      }
      std::
      _Rb_tree<agge::font_descriptor,_std::pair<const_agge::font_descriptor,_agge::tests::mocks::font_accessor>,_std::_Select1st<std::pair<const_agge::font_descriptor,_agge::tests::mocks::font_accessor>_>,_std::less<agge::font_descriptor>,_std::allocator<std::pair<const_agge::font_descriptor,_agge::tests::mocks::font_accessor>_>_>
      ::~_Rb_tree((_Rb_tree<agge::font_descriptor,_std::pair<const_agge::font_descriptor,_agge::tests::mocks::font_accessor>,_std::_Select1st<std::pair<const_agge::font_descriptor,_agge::tests::mocks::font_accessor>_>,_std::less<agge::font_descriptor>,_std::allocator<std::pair<const_agge::font_descriptor,_agge::tests::mocks::font_accessor>_>_>
                   *)&local_328);
      std::
      vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
      ::~vector(&local_340);
      lVar9 = -0x1b0;
      this_00 = &local_110.second;
      do {
        mocks::font_accessor::~font_accessor(this_00);
        pgVar2 = this_00[-1]._glyphs.
                 super__Vector_base<agge::tests::mocks::font_accessor::glyph,_std::allocator<agge::tests::mocks::font_accessor::glyph>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pointer)&this_00[-1]._glyphs.
                      super__Vector_base<agge::tests::mocks::font_accessor::glyph,_std::allocator<agge::tests::mocks::font_accessor::glyph>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != pgVar2) {
          operator_delete(pgVar2);
        }
        this_00 = (font_accessor *)&this_00[-2]._glyphs;
        lVar9 = lVar9 + 0xd8;
      } while (lVar9 != 0);
      if (pp_Stack_368 != (__buckets_ptr)0x0) {
        operator_delete(pp_Stack_368);
      }
      return;
    }
    pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion
              (pFVar8,&local_3e0.family,(LocationInfo *)(local_428 + 0x20));
    __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_3e0.family._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar8,&local_3e0.family,(LocationInfo *)(local_428 + 0x20));
  __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( GarbageFontIsReusedForTheSameRequest )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'a', 0 }, };
				mocks::font_accessor::glyph glyphs[] = { mocks::glyph(5.2, 0, c_outline_1), };
				pair<font_descriptor, mocks::font_accessor> fonts[] = {
					make_pair(font_descriptor::create("Arial", 10, regular, false, hint_strong),
						mocks::font_accessor(c_fm2, indices, glyphs)),
					make_pair(font_descriptor::create("Tahoma", 10, bold, false, hint_strong),
						mocks::font_accessor(c_fm2, indices, glyphs)),
				};
				mocks::fonts_loader loader(fonts);
				mocks::logging_text_engine e(loader, 1);
				font::ptr f1 = e.create_font(font_descriptor::create("Arial", 10, regular, false, hint_strong));
				font::ptr f2 = e.create_font(font_descriptor::create("Tahoma", 10, bold, false, hint_strong));
				void *pvf1 = f1.get();
				void *pvf2 = f2.get();

				loader.created_log.clear();
				f1.reset();
				f2.reset();

				// ACT
				f2 = e.create_font(font_descriptor::create("Tahoma", 10, bold, false, hint_strong));

				// ASSERT
				assert_equal(pvf2, f2.get());
				assert_is_empty(loader.created_log);

				// ACT
				f1 = e.create_font(font_descriptor::create("Arial", 10, regular, false, hint_strong));

				// ASSERT
				assert_equal(pvf1, f1.get());
				assert_is_empty(loader.created_log);

				// ACT
				e.collect();

				// ASSERT
				assert_equal(2u, *loader.allocated);
			}